

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

uchar * BufferToUINT32(bool bReverseByteOrder,uchar *buffer,uchar *buffer_end,ON__UINT32 *u32)

{
  uchar *puVar1;
  
  if ((long)buffer_end - (long)buffer < 4 || buffer_end <= buffer) {
    return (uchar *)0x0;
  }
  if (u32 != (ON__UINT32 *)0x0) {
    if (bReverseByteOrder) {
      *(uchar *)u32 = buffer[3];
      *(uchar *)((long)u32 + 1) = buffer[2];
      *(uchar *)((long)u32 + 2) = buffer[1];
      puVar1 = buffer;
    }
    else {
      *(uchar *)u32 = *buffer;
      *(uchar *)((long)u32 + 1) = buffer[1];
      *(uchar *)((long)u32 + 2) = buffer[2];
      puVar1 = buffer + 3;
    }
    *(uchar *)((long)u32 + 3) = *puVar1;
  }
  return buffer + 4;
}

Assistant:

static
const unsigned char* BufferToUINT32(
          bool bReverseByteOrder,
          const unsigned char* buffer, 
          const unsigned char* buffer_end,
          ON__UINT32* u32 )
{
  if ( buffer >= buffer_end || buffer_end - buffer < 4 )
    return 0;
  if ( u32 )
  {
    unsigned char* dst = (unsigned char*)u32;
    if ( bReverseByteOrder )
    {
      dst[0] = buffer[3];
      dst[1] = buffer[2];
      dst[2] = buffer[1];
      dst[3] = buffer[0];
    }
    else
    {
      dst[0] = buffer[0];
      dst[1] = buffer[1];
      dst[2] = buffer[2];
      dst[3] = buffer[3];
    }
  }
  return buffer+4;
}